

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O2

int WebPWriteTIFF(FILE *fout,WebPDecBuffer *buffer)

{
  WEBP_CSP_MODE WVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  byte bVar6;
  int iVar7;
  uint8_t *__ptr;
  bool bVar8;
  undefined4 local_108;
  undefined1 local_104;
  uint local_103;
  undefined2 local_ff;
  undefined7 local_fd;
  undefined1 uStack_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  undefined4 uStack_f2;
  undefined1 local_ee;
  int local_ed;
  undefined1 local_e9;
  undefined1 local_e8;
  undefined1 local_e7;
  undefined2 local_e6;
  undefined1 local_e4;
  int local_e3;
  undefined1 local_df;
  undefined8 local_de;
  undefined8 uStack_d6;
  undefined8 local_ce;
  undefined8 uStack_c6;
  undefined8 local_be;
  undefined8 uStack_b6;
  undefined8 local_ae;
  undefined1 local_a6;
  int local_a5;
  undefined7 uStack_a1;
  undefined1 local_9a;
  int local_99;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined4 uStack_92;
  undefined1 local_8e;
  int local_8d;
  undefined1 local_89;
  undefined1 local_88;
  undefined1 local_87;
  undefined8 local_86;
  undefined8 uStack_7e;
  undefined8 local_76;
  undefined8 uStack_6e;
  undefined8 local_66;
  undefined8 uStack_5e;
  undefined4 local_56;
  undefined1 local_52;
  int local_51;
  undefined4 uStack_4d;
  undefined3 uStack_49;
  undefined8 local_46;
  undefined8 uStack_3e;
  
  local_108 = 0x2a4949;
  local_104 = 8;
  local_ff = 0;
  local_fd = 0x1000301;
  uStack_f2 = 0x30101;
  local_ee = 1;
  local_e6 = 0x102;
  local_e4 = 3;
  local_df = 0;
  local_de = 0x30103000000c2;
  uStack_d6 = 0x100000001;
  local_ce = 0x100030106;
  uStack_c6 = 0x4011100000002;
  local_be = 0xd200000001;
  uStack_b6 = 0x100030112;
  local_ae = 0x3011500000001;
  local_a6 = 1;
  uStack_a1 = 0x30116000000;
  local_9a = 1;
  uStack_92 = 0x40117;
  local_8e = 1;
  local_86 = 0x10005011a;
  uStack_7e = 0x5011b000000ca;
  local_76 = 0xca00000001;
  uStack_6e = 0x10003011c;
  local_66 = 0x3012800000001;
  uStack_5e = 0x200000001;
  local_56 = 0x30152;
  local_52 = 1;
  uStack_4d = 0;
  uStack_49 = 0;
  local_46 = 0x8000800080008;
  uStack_3e = 0x100000048;
  iVar7 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) {
    WVar1 = buffer->colorspace;
    if ((WVar1 - MODE_RGBA < 0xc) && ((0x81dU >> (WVar1 - MODE_RGBA & 0x1f) & 1) != 0)) {
      bVar8 = false;
    }
    else {
      bVar8 = WVar1 - MODE_YUV < 0xfffffffc;
    }
    __ptr = (buffer->u).RGBA.rgba;
    if (__ptr != (uint8_t *)0x0) {
      uVar2 = buffer->width;
      iVar7 = buffer->height;
      iVar3 = (buffer->u).RGBA.stride;
      bVar6 = 4 - bVar8;
      local_a5 = (uint)bVar6 << 0x18;
      local_e3 = (uint)bVar6 << 8;
      local_103 = (uint)bVar8 << 0x18 ^ 0xf000000;
      local_51 = (uint)(byte)((WVar1 - MODE_YUV < 0xfffffffc) + 1) << 0x18;
      uStack_f6 = (undefined1)uVar2;
      local_f5 = (undefined1)(uVar2 >> 8);
      local_f4 = (undefined1)(uVar2 >> 0x10);
      local_f3 = (undefined1)(uVar2 >> 0x18);
      local_ed = iVar7 << 0x18;
      local_e9 = (undefined1)((uint)iVar7 >> 8);
      local_e8 = (undefined1)((uint)iVar7 >> 0x10);
      local_e7 = (undefined1)((uint)iVar7 >> 0x18);
      local_99 = iVar7 << 0x18;
      iVar4 = (4 - (uint)bVar8) * uVar2 * iVar7;
      local_8d = iVar4 * 0x1000000;
      local_89 = (undefined1)((uint)iVar4 >> 8);
      local_88 = (undefined1)((uint)iVar4 >> 0x10);
      local_87 = (undefined1)((uint)iVar4 >> 0x18);
      if (bVar8 != false) {
        local_56 = 0;
      }
      uStack_95 = local_e9;
      uStack_94 = local_e8;
      uStack_93 = local_e7;
      sVar5 = fwrite(&local_108,0xd2,1,(FILE *)fout);
      if (sVar5 == 1) {
        while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
          sVar5 = fwrite(__ptr,(ulong)bVar6,(ulong)uVar2,(FILE *)fout);
          if (sVar5 != uVar2) goto LAB_001043ec;
          __ptr = __ptr + iVar3;
        }
        iVar7 = 1;
      }
      else {
LAB_001043ec:
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

int WebPWriteTIFF(FILE* fout, const WebPDecBuffer* const buffer) {
  int has_alpha;
  uint32_t width, height;
  uint8_t* rgba;
  int stride;
  uint8_t bytes_per_px = 0;
  const uint8_t assoc_alpha = 0;
  // For non-alpha case, we omit tag 0x152 (ExtraSamples).
  const uint8_t num_ifd_entries = 0;
  uint8_t tiff_header[TIFF_HEADER_SIZE] = {
    0x49, 0x49, 0x2a, 0x00,   // little endian signature
    8, 0, 0, 0,               // offset to the unique IFD that follows
    // IFD (offset = 8). Entries must be written in increasing tag order.
    num_ifd_entries, 0,       // Number of entries in the IFD (12 bytes each).
    0x00, 0x01, 3, 0, 1, 0, 0, 0, 0, 0, 0, 0,    //  10: Width  (TBD)
    0x01, 0x01, 3, 0, 1, 0, 0, 0, 0, 0, 0, 0,    //  22: Height (TBD)
    0x02, 0x01, 3, 0, bytes_per_px, 0, 0, 0,     //  34: BitsPerSample: 8888
        EXTRA_DATA_OFFSET + 0, 0, 0, 0,
    0x03, 0x01, 3, 0, 1, 0, 0, 0, 1, 0, 0, 0,    //  46: Compression: none
    0x06, 0x01, 3, 0, 1, 0, 0, 0, 2, 0, 0, 0,    //  58: Photometric: RGB
    0x11, 0x01, 4, 0, 1, 0, 0, 0,                //  70: Strips offset:
        TIFF_HEADER_SIZE, 0, 0, 0,               //      data follows header
    0x12, 0x01, 3, 0, 1, 0, 0, 0, 1, 0, 0, 0,    //  82: Orientation: topleft
    0x15, 0x01, 3, 0, 1, 0, 0, 0,                //  94: SamplesPerPixels
        bytes_per_px, 0, 0, 0,
    0x16, 0x01, 3, 0, 1, 0, 0, 0, 0, 0, 0, 0,    // 106: Rows per strip (TBD)
    0x17, 0x01, 4, 0, 1, 0, 0, 0, 0, 0, 0, 0,    // 118: StripByteCount (TBD)
    0x1a, 0x01, 5, 0, 1, 0, 0, 0,                // 130: X-resolution
        EXTRA_DATA_OFFSET + 8, 0, 0, 0,
    0x1b, 0x01, 5, 0, 1, 0, 0, 0,                // 142: Y-resolution
        EXTRA_DATA_OFFSET + 8, 0, 0, 0,
    0x1c, 0x01, 3, 0, 1, 0, 0, 0, 1, 0, 0, 0,    // 154: PlanarConfiguration
    0x28, 0x01, 3, 0, 1, 0, 0, 0, 2, 0, 0, 0,    // 166: ResolutionUnit (inch)
    0x52, 0x01, 3, 0, 1, 0, 0, 0,
        assoc_alpha, 0, 0, 0,                    // 178: ExtraSamples: rgbA/RGBA
    0, 0, 0, 0,                                  // 190: IFD terminator
    // EXTRA_DATA_OFFSET:
    8, 0, 8, 0, 8, 0, 8, 0,      // BitsPerSample
    72, 0, 0, 0, 1, 0, 0, 0      // 72 pixels/inch, for X/Y-resolution
  };
  uint32_t y;

  if (fout == NULL || buffer == NULL) return 0;

  has_alpha = WebPIsAlphaMode(buffer->colorspace);
  width = buffer->width;
  height = buffer->height;
  rgba = buffer->u.RGBA.rgba;
  stride = buffer->u.RGBA.stride;

  if (rgba == NULL) return 0;

  // Update bytes_per_px, num_ifd_entries and assoc_alpha.
  tiff_header[38] = tiff_header[102] = bytes_per_px = has_alpha ? 4 : 3;
  tiff_header[8] = has_alpha ? NUM_IFD_ENTRIES : NUM_IFD_ENTRIES - 1;
  tiff_header[186] = WebPIsPremultipliedMode(buffer->colorspace) ? 1 : 2;

  // Fill placeholders in IFD:
  PutLE32(tiff_header + 10 + 8, width);
  PutLE32(tiff_header + 22 + 8, height);
  PutLE32(tiff_header + 106 + 8, height);
  PutLE32(tiff_header + 118 + 8, width * bytes_per_px * height);
  if (!has_alpha) PutLE32(tiff_header + 178, 0);  // IFD terminator

  // write header
  if (fwrite(tiff_header, sizeof(tiff_header), 1, fout) != 1) {
    return 0;
  }
  // write pixel values
  for (y = 0; y < height; ++y) {
    if (fwrite(rgba, bytes_per_px, width, fout) != width) {
      return 0;
    }
    rgba += stride;
  }

  return 1;
}